

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O0

void __thiscall
ut11::
Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
::operator()(Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            function<void_()> *args_1)

{
  bool bVar1;
  function<void_()> local_60;
  string local_40 [32];
  function<void_()> *local_20;
  function<void_()> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
  *this_local;
  
  local_20 = args_1;
  args_local_1 = (function<void_()> *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  bVar1 = std::function::operator_cast_to_bool((function *)this);
  if (bVar1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::function<void_()>_&)>
    ::operator()(&this->m_callbackHandler,args,args_1);
  }
  std::__cxx11::string::string(local_40,(string *)args);
  std::function<void_()>::function(&local_60,args_1);
  detail::
  MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::AddCall(&this->m_argumentHandler,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,&local_60)
  ;
  std::function<void_()>::~function(&local_60);
  std::__cxx11::string::~string(local_40);
  detail::
  MockReturnHandler<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::operator()(&this->m_returnHandler,args,args_1);
  return;
}

Assistant:

R operator()(ARGS... args)
		{
			if ( m_callbackHandler )
				m_callbackHandler(args...);

			m_argumentHandler.AddCall(args...);
			return m_returnHandler(args...);
		}